

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_splitor_test.cc
# Opt level: O0

void __thiscall xLearn::SpliterTest::TearDown(SpliterTest *this)

{
  undefined8 uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  string filename;
  int i;
  char *in_stack_000000d0;
  string local_30 [36];
  uint local_c;
  
  for (local_c = 0; (int)local_c < 5; local_c = local_c + 1) {
    uVar1 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)local_30,"%s_%d",uVar1,(ulong)local_c,in_R8,in_R9,local_30);
    std::__cxx11::string::c_str();
    RemoveFile(in_stack_000000d0);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::c_str();
  RemoveFile(in_stack_000000d0);
  return;
}

Assistant:

virtual void TearDown() {
    for (int i = 0; i < kNumfolds; ++i) {
      string filename = StringPrintf("%s_%d", kTestfilename.c_str(), i);
      RemoveFile(filename.c_str());
    }
    RemoveFile(kTestfilename.c_str());
  }